

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_set_data(Integer g_a,Integer ndim,Integer *dims,Integer type)

{
  global_array_t *pgVar1;
  bool bVar2;
  global_array_t *pgVar3;
  Integer IVar4;
  long lVar5;
  
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot set data on array that has been allocated",0);
  }
  if (ndim - 8U < 0xfffffffffffffff9) {
    pnga_error("unsupported number of dimensions",ndim);
    if (0 < ndim) goto LAB_00161958;
    bVar2 = false;
  }
  else {
LAB_00161958:
    lVar5 = 0;
    do {
      if (dims[lVar5] < 1) {
        pnga_error("wrong dimension specified",dims[lVar5]);
      }
      lVar5 = lVar5 + 1;
    } while (ndim != lVar5);
    bVar2 = true;
  }
  lVar5 = g_a + 1000;
  IVar4 = pnga_type_f2c(type);
  if (999 < IVar4) {
    IVar4 = pnga_type_f2c(type);
    if (IVar4 < 0x4e8) {
      IVar4 = pnga_type_f2c(type);
      if (*(int *)(BYTE_ARRAY_001d31f9 + IVar4 * 0x10 + 0x107) != 0) goto LAB_001619df;
    }
  }
  IVar4 = pnga_type_f2c(type);
  pnga_error("type not yet supported",IVar4);
LAB_001619df:
  IVar4 = pnga_type_f2c((long)(int)type);
  pgVar3 = GA;
  pgVar1 = GA + lVar5;
  GA[lVar5].type = (int)IVar4;
  pgVar3[lVar5].elemsize =
       *(int *)((long)&ga_types[0].size + ((IVar4 << 0x20) + -0x3e800000000 >> 0x1c));
  if (bVar2) {
    lVar5 = 0;
    do {
      pgVar3[g_a + 1000].dims[lVar5] = dims[lVar5];
      pgVar3[g_a + 1000].chunk[lVar5] = 0;
      pgVar3[g_a + 1000].width[lVar5] = 0;
      lVar5 = lVar5 + 1;
    } while (ndim != lVar5);
  }
  pgVar1->ndim = (short)ndim;
  return;
}

Assistant:

void pnga_set_data(Integer g_a, Integer ndim, Integer *dims, Integer type)
{
  Integer i;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set data on array that has been allocated",0);
  gam_checkdim(ndim, dims);
  gam_checktype(pnga_type_f2c(type));

  GA[ga_handle].type = pnga_type_f2c((int)(type));
  GA[ga_handle].elemsize = GAsizeofM(GA[ga_handle].type);

  for (i=0; i<ndim; i++) {
    GA[ga_handle].dims[i] = (C_Integer)dims[i];
    GA[ga_handle].chunk[i] = 0;
    GA[ga_handle].width[i] = 0;
  }
  GA[ga_handle].ndim = (int)(ndim);
}